

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::RepeatedFieldHelper<6>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  int index;
  RepeatedField<unsigned_long> *array;
  uint32_t local_2c;
  
  if (0 < *field) {
    index = 0;
    do {
      local_2c = md->tag;
      OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_2c,output);
      puVar2 = RepeatedField<unsigned_long>::Get((RepeatedField<unsigned_long> *)field,index);
      puVar1 = (unsigned_long *)output->ptr;
      *puVar1 = *puVar2;
      output->ptr = (uint8_t *)(puVar1 + 1);
      index = index + 1;
    } while (index < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }